

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

long ndiSignedToLong(char *cp,int n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = 1;
  lVar2 = lVar1;
  if (*cp != '+') {
    if (*cp != '-') {
      return 0;
    }
    lVar2 = -1;
  }
  lVar3 = 0;
  for (; (lVar1 < n && ((byte)(cp[lVar1] - 0x30U) < 10)); lVar1 = lVar1 + 1) {
    lVar3 = (ulong)((byte)cp[lVar1] & 0xf) + lVar3 * 10;
  }
  return lVar3 * lVar2;
}

Assistant:

ndicapiExport long ndiSignedToLong(const char* cp, int n)
{
  int i;
  int c;
  long result = 0;
  int sign = 1;

  c = cp[0];

  if (c == '+')
  {
    sign = 1;
  }
  else if (c == '-')
  {
    sign = -1;
  }
  else
  {
    return 0;
  }

  for (i = 1; i < n; i++)
  {
    c = cp[i];
    if (c >= '0' && c <= '9')
    {
      result = (result * 10) + (c - '0');
    }
    else
    {
      break;
    }
  }

  return sign * result;
}